

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O2

void __thiscall
HttpReqThread::HttpReqThread
          (HttpReqThread *this,vm_val_t *id,char *url,char *verb,int32_t options,char *hdrs,
          vm_val_t *body,char *body_type,vm_rcdesc *rc)

{
  OS_Counter *pOVar1;
  long *__s1;
  ushort uVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  TadsMessageQueue *pTVar5;
  int iVar6;
  vm_globalvar_t *pvVar7;
  OS_HttpPayload *this_00;
  CVmDataSource *stream;
  unsigned_short uVar8;
  long lVar9;
  HttpReqThread *mime_type;
  uint uVar10;
  ulong uVar11;
  size_t sVar12;
  char *str;
  char *pcVar13;
  char *str_00;
  iter_body_table_ctx ctx;
  
  OS_Thread::OS_Thread(&this->super_OS_Thread);
  (this->super_OS_Thread).super_CVmWeakRefable.super_CVmRefCntObj._vptr_CVmRefCntObj =
       (_func_int **)&PTR__HttpReqThread_003431e0;
  (this->super_OS_Thread).super_OS_Waitable._vptr_OS_Waitable =
       (_func_int **)&PTR__HttpReqThread_00343210;
  this->vmg = (vm_globals *)0x0;
  pTVar5 = G_net_queue_X;
  this->queue = G_net_queue_X;
  if (pTVar5 != (TadsMessageQueue *)0x0) {
    LOCK();
    pOVar1 = &(pTVar5->super_CVmRefCntObj).cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  pvVar7 = CVmObjTable::create_global_var(&G_obj_table_X);
  this->idg = pvVar7;
  uVar4 = *(undefined4 *)&id->field_0x4;
  aVar3 = id->val;
  (pvVar7->val).typ = id->typ;
  *(undefined4 *)&(pvVar7->val).field_0x4 = uVar4;
  (pvVar7->val).val = aVar3;
  this->options = options;
  uVar2 = *(ushort *)url;
  uVar11 = (ulong)uVar2;
  __s1 = (long *)(url + 2);
  uVar10 = 0;
  if (7 < uVar11) {
    iVar6 = bcmp(__s1,"https://",8);
    uVar10 = (uint)(iVar6 == 0);
  }
  this->https = uVar10;
  this->host = (char *)0x0;
  this->resource = (char *)0x0;
  uVar8 = 0x1bb;
  if (uVar10 == 0) {
    uVar8 = 0x50;
  }
  this->port = uVar8;
  if (uVar2 < 7) {
    lVar9 = 0;
  }
  else {
    iVar6 = bcmp(__s1,"http://",7);
    lVar9 = 0;
    if (iVar6 == 0) {
      lVar9 = 7;
    }
    if (iVar6 != 0 && 7 < uVar2) {
      lVar9 = (ulong)(*__s1 == 0x2f2f3a7370747468) << 3;
    }
  }
  str = (char *)((long)__s1 + lVar9);
  sVar12 = uVar11 - lVar9;
  for (pcVar13 = str;
      ((str_00 = url + uVar11 + 2, sVar12 != 0 && (str_00 = pcVar13, *pcVar13 != '/')) &&
      (*pcVar13 != ':')); pcVar13 = pcVar13 + 1) {
    sVar12 = sVar12 - 1;
  }
  pcVar13 = lib_copy_str(str,(long)str_00 - (long)str);
  this->host = pcVar13;
  if (sVar12 == 0) {
LAB_002036bc:
    pcVar13 = lib_copy_str("/");
  }
  else {
    if (*str_00 == ':') {
      iVar6 = 0;
      do {
        this->port = (unsigned_short)iVar6;
        do {
          sVar12 = sVar12 - 1;
          str_00 = str_00 + 1;
          if (sVar12 == 0) goto LAB_002036bc;
          if (*str_00 == 0x2f) goto LAB_002036ca;
          uVar10 = (int)*str_00 - 0x30;
        } while (9 < uVar10);
        iVar6 = iVar6 * 10 + uVar10;
      } while( true );
    }
LAB_002036ca:
    pcVar13 = lib_copy_str(str_00,sVar12);
  }
  this->resource = pcVar13;
  pcVar13 = lib_copy_str(verb + 2,(ulong)*(ushort *)verb);
  this->verb = pcVar13;
  if (hdrs == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    pcVar13 = lib_copy_str(hdrs + 2,(ulong)*(ushort *)hdrs);
  }
  this->hdrs = pcVar13;
  this->body = (OS_HttpPayload *)0x0;
  if (body != (vm_val_t *)0x0) {
    this_00 = (OS_HttpPayload *)operator_new(0x10);
    OS_HttpPayload::OS_HttpPayload(this_00);
    this->body = this_00;
    if ((body->typ == VM_OBJ) &&
       (iVar6 = CVmObjLookupTable::is_lookup_table_obj((body->val).obj), iVar6 != 0)) {
      ctx.rc = rc;
      ctx.self = this;
      CVmObjLookupTable::for_each
                ((CVmObjLookupTable *)
                 (G_obj_table_X.pages_[(body->val).obj >> 0xc] + ((body->val).obj & 0xfff)),
                 iter_body_table,&ctx);
    }
    else {
      ctx.self = (HttpReqThread *)0x0;
      stream = val_to_ds(body,(char **)&ctx);
      mime_type = ctx.self;
      if (ctx.self == (HttpReqThread *)0x0) {
        sVar12 = 0;
      }
      else {
        sVar12 = strlen((char *)ctx.self);
      }
      if (body_type != (char *)0x0) {
        sVar12 = (size_t)*(ushort *)body_type;
        mime_type = (HttpReqThread *)(body_type + 2);
      }
      OS_HttpPayload::add(this->body,"",0,"",0,(char *)mime_type,sVar12,stream);
    }
  }
  return;
}

Assistant:

HttpReqThread(VMG_ const vm_val_t *id, const char *url,
                  const char *verb, int32_t options,
                  const char *hdrs, vm_val_t *body, const char *body_type,
                  const vm_rcdesc *rc)
    {
        /* save the VM globals */
        vmg = VMGLOB_ADDR;

        /* add a reference on the net event queue */
        if ((queue = G_net_queue) != 0)
            queue->add_ref();

        /* create a global for the ID value */
        idg = G_obj_table->create_global_var();
        idg->val = *id;

        /* save the option flags */
        this->options = options;

        /* set up to parse the URL */
        size_t urll = vmb_get_len(url);
        url += VMB_LEN;

        /* note whether the scheme is plain http or https */
        https = (urll >= 8 && memcmp(url, "https://", 8) == 0);

        /* we don't have any URL pieces yet */
        host = 0;
        resource = 0;
        port = (https ? 443 : 80);

        /* skip the scheme prefix */
        size_t pfx = (urll >= 7 && memcmp(url, "http://", 7) == 0 ? 7 :
                      urll >= 8 && memcmp(url, "https://", 8) == 0 ? 8 : 0);
        url += pfx, urll -= pfx;

        /* the host name is the part up to the ':', '/', or end of string */
        const char *start;
        for (start = url ; urll > 0 && *url != ':' && *url != '/' ;
             ++url, --urll) ;

        /* save the host name */
        host = lib_copy_str(start, url - start);

        /* parse the port, if present */
        if (urll > 0 && *url == ':')
        {
            /* parse the port number string */
            for (--urll, start = ++url, port = 0 ; urll > 0 && *url != '/' ;
                 ++url, --urll)
            {
                if (is_digit(*url))
                    port = port*10 + value_of_digit(*url);
            }
        }

        /* 
         *   The rest (including the '/') is the resource string.  If there's
         *   nothing left, the resource is implicitly '/'. 
         */
        if (urll > 0)
            resource = lib_copy_str(url, urll);
        else
            resource = lib_copy_str("/");

        /* make null-terminated copies of the various strings */
        this->verb = lib_copy_str(verb + VMB_LEN, vmb_get_len(verb));
        this->hdrs = (hdrs == 0 ? 0 :
                      lib_copy_str(hdrs + VMB_LEN, vmb_get_len(hdrs)));

        /* if there's a content body, set up the payload */
        this->body = 0;
        if (body != 0)
        {
            /* set up an empty payload */
            this->body = new OS_HttpPayload();
            
            /* 
             *   Convert the body to a stream payload, if it's a string or
             *   ByteArray.  If it's a LookupTable, it's a set of form
             *   fields.
             */
            if (body->typ == VM_OBJ
                && CVmObjLookupTable::is_lookup_table_obj(vmg_ body->val.obj))
            {
                /* 
                 *   The body is a LookupTable, so we have a set of form
                 *   fields to encode as HTML form data. 
                 */
                
                /* cast the object value */
                CVmObjLookupTable *tab =
                    (CVmObjLookupTable *)vm_objp(vmg_ body->val.obj);
                
                /* add each key in the table as a form field */
                iter_body_table_ctx ctx(this, rc);
                tab->for_each(vmg_ iter_body_table, &ctx);
            }
            else
            {
                /* 
                 *   It's not a lookup table, so it must be bytes to upload,
                 *   as a string or ByteArray.
                 */
                const char *def_mime_type = 0;
                CVmDataSource *s = val_to_ds(vmg_ body, &def_mime_type);
                
                /* presume we're going to use the default mime type */
                const char *mime_type = def_mime_type;
                size_t mime_type_len =
                    (mime_type != 0 ? strlen(mime_type) : 0);

                /* if the caller specified a mime type, use it instead */
                if (body_type != 0)
                {
                    mime_type = body_type + VMB_LEN;
                    mime_type_len = vmb_get_len(body_type);
                }
                
                /* add the stream */
                this->body->add(
                    "", 0, "", 0, mime_type, mime_type_len, s);
            }
        }
    }